

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

bool __thiscall QRasterPaintEngine::begin(QRasterPaintEngine *this,QPaintDevice *device)

{
  undefined4 uVar1;
  int iVar2;
  ClassId CVar3;
  QRasterPaintEnginePrivate *pQVar4;
  QPlatformPixmap *this_00;
  undefined4 extraout_var;
  QRasterPaintEngineState *pQVar5;
  QRasterizer *this_01;
  QRasterBuffer *pQVar6;
  QPaintDevice *in_RSI;
  QPaintEngine *in_RDI;
  long in_FS_OFFSET;
  QBrush *unaff_retaddr;
  QSpanData *in_stack_00000008;
  QRasterPaintEngineState *s;
  QPlatformPixmap *pd;
  QPixmap *pixmap;
  QRasterPaintEnginePrivate *d;
  QFlagsStorage<QPaintEngine::DirtyFlag> in_stack_ffffffffffffff5c;
  QRasterPaintEngine *in_stack_ffffffffffffff60;
  QSpanData *this_02;
  QRect *r;
  QOutlineMapper *in_stack_ffffffffffffff70;
  QStrokerOps *this_03;
  QRect in_stack_ffffffffffffffd0;
  undefined1 isCosmetic;
  long lVar7;
  
  lVar7 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QRasterPaintEngine *)0x5604a5);
  iVar2 = (*in_RSI->_vptr_QPaintDevice[2])();
  if (iVar2 == 2) {
    this_00 = QPixmap::handle((QPixmap *)0x5604ce);
    CVar3 = QPlatformPixmap::classId(this_00);
    if ((CVar3 == RasterClass) || (CVar3 = QPlatformPixmap::classId(this_00), CVar3 == BlitterClass)
       ) {
      iVar2 = (*this_00->_vptr_QPlatformPixmap[0x16])();
      pQVar4->device = (QPaintDevice *)CONCAT44(extraout_var,iVar2);
    }
  }
  else {
    pQVar4->device = in_RSI;
  }
  (pQVar4->super_QPaintEngineExPrivate).super_QPaintEnginePrivate.pdev = pQVar4->device;
  (*(pQVar4->super_QPaintEngineExPrivate).super_QPaintEnginePrivate._vptr_QPaintEnginePrivate[2])();
  pQVar5 = state((QRasterPaintEngine *)0x56054b);
  ensureOutlineMapper(in_stack_ffffffffffffff60);
  QScopedPointer<QOutlineMapper,_QScopedPointerDeleter<QOutlineMapper>_>::operator->
            (&pQVar4->outlineMapper);
  uVar1 = (pQVar4->deviceRect).y2;
  isCosmetic = (undefined1)((uint)uVar1 >> 0x18);
  QOutlineMapper::setClipRect(in_stack_ffffffffffffff70,in_stack_ffffffffffffffd0);
  this_01 = QScopedPointer<QRasterizer,_QScopedPointerDeleter<QRasterizer>_>::operator->
                      (&pQVar4->rasterizer);
  QRasterizer::setClipRect(this_01,&pQVar4->deviceRect);
  this_02 = &pQVar5->penData;
  pQVar6 = QScopedPointer<QRasterBuffer,_QScopedPointerDeleter<QRasterBuffer>_>::data
                     (&pQVar4->rasterBuffer);
  QSpanData::init(this_02,(EVP_PKEY_CTX *)pQVar6);
  r = (QRect *)&pQVar5->penData;
  QPen::brush((QPen *)r);
  QSpanData::setup(in_stack_00000008,unaff_retaddr,(int)((ulong)lVar7 >> 0x20),
                   (CompositionMode)lVar7,(bool)isCosmetic);
  QBrush::~QBrush((QBrush *)0x56067e);
  pQVar5->stroker = &(pQVar4->basicStroker).super_QStrokerOps;
  this_03 = &(pQVar4->basicStroker).super_QStrokerOps;
  QRectF::QRectF((QRectF *)this_03,r);
  QStrokerOps::setClipRect(this_03,(QRectF *)&stack0xffffffffffffffc0);
  pQVar6 = QScopedPointer<QRasterBuffer,_QScopedPointerDeleter<QRasterBuffer>_>::data
                     (&pQVar4->rasterBuffer);
  QSpanData::init(&pQVar5->brushData,(EVP_PKEY_CTX *)pQVar6);
  QSpanData::setup(in_stack_00000008,unaff_retaddr,(int)((ulong)lVar7 >> 0x20),
                   (CompositionMode)lVar7,(bool)isCosmetic);
  pQVar6 = QScopedPointer<QRasterBuffer,_QScopedPointerDeleter<QRasterBuffer>_>::operator->
                     (&pQVar4->rasterBuffer);
  pQVar6->compositionMode = CompositionMode_SourceOver;
  QFlags<QPaintEngine::DirtyFlag>::QFlags
            ((QFlags<QPaintEngine::DirtyFlag> *)this_02,in_stack_ffffffffffffff5c.i);
  QPaintEngine::setDirty((QPaintEngine *)0x560788,(DirtyFlags)in_stack_ffffffffffffff5c.i);
  if ((pQVar4->field_0x65c & 1) == 0) {
    pQVar4->glyphCacheFormat = Format_A8;
  }
  else {
    pQVar4->glyphCacheFormat = Format_Mono;
  }
  QPaintEngine::setActive(in_RDI,true);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar7) {
    __stack_chk_fail();
  }
  return true;
}

Assistant:

bool QRasterPaintEngine::begin(QPaintDevice *device)
{
    Q_D(QRasterPaintEngine);

    if (device->devType() == QInternal::Pixmap) {
        QPixmap *pixmap = static_cast<QPixmap *>(device);
        QPlatformPixmap *pd = pixmap->handle();
        if (pd->classId() == QPlatformPixmap::RasterClass || pd->classId() == QPlatformPixmap::BlitterClass)
            d->device = pd->buffer();
    } else {
        d->device = device;
    }

    // Make sure QPaintEngine::paintDevice() returns the proper device.
    d->pdev = d->device;

    Q_ASSERT(d->device->devType() == QInternal::Image
             || d->device->devType() == QInternal::CustomRaster);

    d->systemStateChanged();

    QRasterPaintEngineState *s = state();
    ensureOutlineMapper();
    d->outlineMapper->setClipRect(d->deviceRect);
    d->rasterizer->setClipRect(d->deviceRect);

    s->penData.init(d->rasterBuffer.data(), this);
    s->penData.setup(s->pen.brush(), s->intOpacity, s->composition_mode, s->flags.cosmetic_brush);
    s->stroker = &d->basicStroker;
    d->basicStroker.setClipRect(d->deviceRect);

    s->brushData.init(d->rasterBuffer.data(), this);
    s->brushData.setup(s->brush, s->intOpacity, s->composition_mode, s->flags.cosmetic_brush);

    d->rasterBuffer->compositionMode = QPainter::CompositionMode_SourceOver;

    setDirty(DirtyBrushOrigin);

#ifdef QT_DEBUG_DRAW
    qDebug() << "QRasterPaintEngine::begin(" << (void *) device
             << ") devType:" << device->devType()
             << "devRect:" << d->deviceRect;
    if (d->baseClip) {
        dumpClip(d->rasterBuffer->width(), d->rasterBuffer->height(), &*d->baseClip);
    }
#endif

    if (d->mono_surface)
        d->glyphCacheFormat = QFontEngine::Format_Mono;
#if defined(Q_OS_WIN)
    else if (clearTypeFontsEnabled())
#else
    else if (false)
#endif
    {
        QImage::Format format = static_cast<QImage *>(d->device)->format();
        if (format == QImage::Format_ARGB32_Premultiplied || format == QImage::Format_RGB32)
            d->glyphCacheFormat = QFontEngine::Format_A32;
        else
            d->glyphCacheFormat = QFontEngine::Format_A8;
    } else
        d->glyphCacheFormat = QFontEngine::Format_A8;

    setActive(true);
    return true;
}